

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SplitBranch<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>,_0UL>
::get(SplitBranch<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>,_0UL>
      *this,ExceptionOrValue *output)

{
  ExceptionOrValue *this_00;
  ExceptionOr<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>_>
  *other;
  Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
  *tuple;
  TypeByIndex<0UL,_kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
  *t;
  Promise<kj::HttpClient::ConnectRequest::Status> *other_00;
  ExceptionOr<kj::Promise<kj::HttpClient::ConnectRequest::Status>_> *pEVar1;
  Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
  *value;
  Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
  *_value869;
  ExceptionOr<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>_>
  *hubResult;
  ExceptionOrValue *output_local;
  SplitBranch<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>,_0UL>
  *this_local;
  
  this_00 = ForkBranchBase::getHubResultRef(&this->super_ForkBranchBase);
  other = ExceptionOrValue::
          as<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>>>>
                    (this_00);
  tuple = readMaybe<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>>>>
                    (&other->value);
  if (tuple == (Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
                *)0x0) {
    pEVar1 = ExceptionOrValue::as<kj::Promise<kj::HttpClient::ConnectRequest::Status>>(output);
    Maybe<kj::Promise<kj::HttpClient::ConnectRequest::Status>_>::operator=
              ((Maybe<kj::Promise<kj::HttpClient::ConnectRequest::Status>_> *)(pEVar1 + 0x198));
  }
  else {
    t = get<0ul,kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>>>&>
                  (tuple);
    other_00 = mv<kj::Promise<kj::HttpClient::ConnectRequest::Status>>(t);
    pEVar1 = ExceptionOrValue::as<kj::Promise<kj::HttpClient::ConnectRequest::Status>>(output);
    Maybe<kj::Promise<kj::HttpClient::ConnectRequest::Status>_>::operator=
              ((Maybe<kj::Promise<kj::HttpClient::ConnectRequest::Status>_> *)(pEVar1 + 0x198),
               other_00);
  }
  Maybe<kj::Exception>::operator=(&output->exception,(Maybe<kj::Exception> *)other);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<Element>().value = kj::mv(kj::get<index>(value));
    } else {
      output.as<Element>().value = kj::none;
    }